

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testModBus(void)

{
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  C *pCVar5;
  C *pCVar6;
  String s_3_5;
  String s_1_5;
  uint64_t timeout_3_5;
  uint64_t timeout_1_5;
  uint_t baud;
  uint8_t packet [6];
  uint64_t in_stack_fffffffffffffee8;
  Time *in_stack_fffffffffffffef0;
  C *in_stack_fffffffffffffef8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this;
  undefined4 in_stack_ffffffffffffff10;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_54;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  uint8_t local_6 [6];
  
  local_6[0] = '\x01';
  local_6[1] = '\x03';
  local_6[2] = '\0';
  local_6[3] = '0';
  local_6[4] = '\0';
  local_6[5] = '\x01';
  uVar1 = crc16_ansi(local_6,6,0);
  uVar2 = (uint)uVar1;
  uVar1 = crc16_ansi(local_6,6,0xffff);
  uVar3 = (uint)uVar1;
  uVar1 = crc16_ccit(local_6,6,0);
  uVar4 = (uint)uVar1;
  uVar1 = crc16_ccit(local_6,6,0xffff);
  printf("crc16        = %04x\ncrc16 modbus = %04x\ncrc16 xmodem = %04x\ncrc16 ffff   = %04x\n",
         (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar1);
  local_c = 0x4b00;
  local_18 = 0x1e84;
  local_20 = 0x4735;
  this = &local_54;
  axl::sys::Time::Time(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (this,in_stack_fffffffffffffef8);
  axl::sys::Time::format
            ((Time *)CONCAT44(uVar4,uVar3),(StringRef *)CONCAT44(uVar2,in_stack_ffffffffffffff10));
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x111b29);
  axl::sys::Time::Time(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (this,in_stack_fffffffffffffef8);
  axl::sys::Time::format
            ((Time *)CONCAT44(uVar4,uVar3),(StringRef *)CONCAT44(uVar2,in_stack_ffffffffffffff10));
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x111b72);
  pCVar5 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                     ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                      in_stack_fffffffffffffef0);
  pCVar6 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                     ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                      in_stack_fffffffffffffef0);
  printf("t_1_5 = %s\nt_3_5 = %s\n",pCVar5,pCVar6);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x111bbb);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x111bc8);
  return;
}

Assistant:

void
testModBus() {
	uint8_t packet[] = {
		0x01, 0x03, 0x00, 0x30, 0x00, 0x01, // 0x00, 0x00,
	};

	printf(
		"crc16        = %04x\n"
		"crc16 modbus = %04x\n"
		"crc16 xmodem = %04x\n"
		"crc16 ffff   = %04x\n",
		crc16_ansi(packet, sizeof(packet), 0),
		crc16_ansi(packet, sizeof(packet), 0xffff),
		crc16_ccit(packet, sizeof(packet), 0),
		crc16_ccit(packet, sizeof(packet), 0xffff)
	);

	uint_t baud = 19200;

	uint64_t timeout_1_5;
	uint64_t timeout_3_5;

	if (baud > 19200) {
		timeout_1_5 = 7500;
		timeout_3_5 = 17500;
	} else {
		timeout_1_5 = 150000000 / baud;
		timeout_3_5 = 350000000 / baud;
	}

	sl::String s_1_5 = sys::Time(timeout_1_5, false).format("%s.%l.%c");
	sl::String s_3_5 = sys::Time(timeout_3_5, false).format("%s.%l.%c");

	printf("t_1_5 = %s\nt_3_5 = %s\n", s_1_5.sz(), s_3_5.sz());
}